

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall
QtMWidgets::MsgBoxTitle::MsgBoxTitle(MsgBoxTitle *this,QString *title,QWidget *parent)

{
  MsgBoxTitlePrivate *this_00;
  MsgBoxTitlePrivate *this_01;
  QFlags<Qt::WindowType> local_24;
  QWidget *local_20;
  QWidget *parent_local;
  QString *title_local;
  MsgBoxTitle *this_local;
  
  local_20 = parent;
  parent_local = (QWidget *)title;
  title_local = (QString *)this;
  QFlags<Qt::WindowType>::QFlags(&local_24);
  QWidget::QWidget(&this->super_QWidget,parent,(QFlags_conflict1 *)(ulong)local_24.i);
  *(undefined ***)this = &PTR_metaObject_0024a740;
  *(undefined ***)&this->field_0x10 = &PTR__MsgBoxTitle_0024a8f0;
  this_00 = (MsgBoxTitlePrivate *)operator_new(0x40);
  MsgBoxTitlePrivate::MsgBoxTitlePrivate(this_00,(QString *)parent_local,this);
  QScopedPointer<QtMWidgets::MsgBoxTitlePrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxTitlePrivate>_>
  ::QScopedPointer(&this->d,this_00);
  this_01 = QScopedPointer<QtMWidgets::MsgBoxTitlePrivate,_QScopedPointerDeleter<QtMWidgets::MsgBoxTitlePrivate>_>
            ::operator->(&this->d);
  MsgBoxTitlePrivate::init(this_01,(EVP_PKEY_CTX *)this_00);
  return;
}

Assistant:

explicit MsgBoxTitle( const QString & title, QWidget * parent = 0 )
		:	QWidget( parent )
		,	d( new MsgBoxTitlePrivate( title, this ) )
	{
		d->init();
	}